

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgramPrivate::~QOpenGLShaderProgramPrivate(QOpenGLShaderProgramPrivate *this)

{
  void *pvVar1;
  QObjectPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QOpenGLShaderProgramPrivate_00213f58;
  pvVar1 = *(void **)(in_RDI + 0xd0);
  if (pvVar1 != (void *)0x0) {
    QOpenGLExtraFunctions::~QOpenGLExtraFunctions((QOpenGLExtraFunctions *)0x172db0);
    operator_delete(pvVar1,8);
  }
  if (*(long *)(in_RDI + 0x78) != 0) {
    QOpenGLSharedResource::free();
  }
  QOpenGLProgramBinaryCache::ProgramDesc::~ProgramDesc((ProgramDesc *)0x172de7);
  QList<QOpenGLShader_*>::~QList((QList<QOpenGLShader_*> *)0x172df7);
  QList<QOpenGLShader_*>::~QList((QList<QOpenGLShader_*> *)0x172e07);
  QString::~QString((QString *)0x172e17);
  QObjectPrivate::~QObjectPrivate(in_RDI);
  return;
}

Assistant:

QOpenGLShaderProgramPrivate::~QOpenGLShaderProgramPrivate()
{
    delete glfuncs;
    if (programGuard)
        programGuard->free();
}